

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O2

char * string_trim(char *string)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  
  if (string == (char *)0x0) {
    __s = (char *)0x0;
  }
  else {
    do {
      __s = string;
      string = __s + 1;
    } while (*__s == ' ');
    sVar2 = strlen(__s);
    pcVar3 = __s + 1 + sVar2;
    do {
      pcVar1 = pcVar3 + -2;
      pcVar3 = pcVar3 + -1;
    } while (*pcVar1 == ' ');
    *pcVar3 = '\0';
  }
  return __s;
}

Assistant:

static char *string_trim(char *string)
{
    char *p = string;
    long len;

    if (string == NULL)
        return NULL;

    while (*p == ' ')
        p++;

    len = strlen(p);

    while (p[len - 1] == ' ')
        len--;
    p[len] = '\0';

    return p;
}